

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall HPresolve::fillStackRowBounds(HPresolve *this,int row)

{
  stack<double,_std::deque<double,_std::allocator<double>_>_> *in_RDI;
  _Elt_pointer *__x;
  
  __x = &in_RDI[9].c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
         super__Deque_impl_data._M_start._M_first;
  std::vector<double,_std::allocator<double>_>::at
            ((vector<double,_std::allocator<double>_> *)in_RDI,(size_type)__x);
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push(in_RDI,(value_type *)__x);
  std::vector<double,_std::allocator<double>_>::at
            ((vector<double,_std::allocator<double>_> *)in_RDI,(size_type)__x);
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push(in_RDI,(value_type *)__x);
  return;
}

Assistant:

void HPresolve::fillStackRowBounds(int row) {
	postValue.push(rowUpper.at(row));
	postValue.push(rowLower.at(row));
}